

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filepath_tests.cpp
# Opt level: O3

void __thiscall
iu_FilePath_x_iutest_x_RemoveExtension_Test::Body(iu_FilePath_x_iutest_x_RemoveExtension_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  _Alloc_hider _Var5;
  char *pcVar6;
  iuFilePath *in_R9;
  AssertionResult iutest_ar;
  FilePath path;
  allocator<char> local_231;
  AssertionResult local_230;
  AssertionHelper local_208;
  iuFilePath local_1d8;
  undefined1 local_1b8 [128];
  ios_base local_138 [264];
  
  iutest::detail::iuFilePath::iuFilePath(&local_1d8,"test.exe");
  iutest::detail::iuFilePath::RemoveExtension((iuFilePath *)local_1b8,&local_1d8,"bin");
  iutest::internal::CmpHelperEQ<char[9],iutest::detail::iuFilePath>
            (&local_230,(internal *)"\"test.exe\"","path.RemoveExtension(\"bin\")","test.exe",
             (char (*) [9])local_1b8,in_R9);
  pcVar4 = local_1b8 + 0x10;
  if ((pointer)local_1b8._0_8_ != pcVar4) {
    operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
  }
  if (local_230.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,local_230.m_message._M_dataplus._M_p,&local_231);
    local_208.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filepath_tests.cpp"
    ;
    local_208.m_part_result.super_iuCodeMessage.m_line = 0xa8;
    local_208.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_208,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_208.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_208.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  paVar1 = &local_230.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_230.m_message._M_dataplus._M_p,
                    local_230.m_message.field_2._M_allocated_capacity + 1);
  }
  iutest::detail::iuFilePath::RemoveExtension((iuFilePath *)local_1b8,&local_1d8,"exe");
  iutest::internal::CmpHelperEQ<char[5],iutest::detail::iuFilePath>
            (&local_230,(internal *)0x327bbe,"path.RemoveExtension(\"exe\")","test",
             (char (*) [5])local_1b8,in_R9);
  if ((pointer)local_1b8._0_8_ != pcVar4) {
    operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
  }
  if (local_230.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,local_230.m_message._M_dataplus._M_p,&local_231);
    local_208.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filepath_tests.cpp"
    ;
    local_208.m_part_result.super_iuCodeMessage.m_line = 0xa9;
    local_208.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_208,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_208.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_208.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_230.m_message._M_dataplus._M_p,
                    local_230.m_message.field_2._M_allocated_capacity + 1);
  }
  _Var5._M_p = local_1d8.m_path._M_dataplus._M_p;
  pcVar6 = strrchr(local_1d8.m_path._M_dataplus._M_p,0x2e);
  if (pcVar6 == (char *)0x0) {
    local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p =
         (pointer)&local_208.m_part_result.super_iuCodeMessage.m_message.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_208,_Var5._M_p,_Var5._M_p + local_1d8.m_path._M_string_length);
  }
  else {
    local_1b8._0_8_ = pcVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,_Var5._M_p,pcVar6);
    iutest::detail::iuFilePath::iuFilePath((iuFilePath *)&local_208,(string *)local_1b8);
    if ((pointer)local_1b8._0_8_ != pcVar4) {
      operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
    }
  }
  iutest::internal::CmpHelperEQ<char[5],iutest::detail::iuFilePath>
            (&local_230,(internal *)0x327bbe,"path.RemoveExtension()","test",
             (char (*) [5])&local_208,in_R9);
  paVar2 = &local_208.m_part_result.super_iuCodeMessage.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar2) {
    operator_delete(local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    local_208.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity + 1);
  }
  if (local_230.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,local_230.m_message._M_dataplus._M_p,&local_231);
    local_208.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filepath_tests.cpp"
    ;
    local_208.m_part_result.super_iuCodeMessage.m_line = 0xab;
    local_208.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_208,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar2) {
      operator_delete(local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_208.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_230.m_message._M_dataplus._M_p,
                    local_230.m_message.field_2._M_allocated_capacity + 1);
  }
  paVar3 = &local_1d8.m_path.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8.m_path._M_dataplus._M_p != paVar3) {
    operator_delete(local_1d8.m_path._M_dataplus._M_p,
                    local_1d8.m_path.field_2._M_allocated_capacity + 1);
  }
  iutest::detail::iuFilePath::iuFilePath(&local_1d8,"test.exe.bin");
  iutest::detail::iuFilePath::RemoveExtension((iuFilePath *)local_1b8,&local_1d8,"bin");
  iutest::internal::CmpHelperEQ<char[9],iutest::detail::iuFilePath>
            (&local_230,(internal *)"\"test.exe\"","path.RemoveExtension(\"bin\")","test.exe",
             (char (*) [9])local_1b8,in_R9);
  if ((pointer)local_1b8._0_8_ != pcVar4) {
    operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
  }
  if (local_230.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,local_230.m_message._M_dataplus._M_p,&local_231);
    local_208.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filepath_tests.cpp"
    ;
    local_208.m_part_result.super_iuCodeMessage.m_line = 0xb0;
    local_208.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_208,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar2) {
      operator_delete(local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_208.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_230.m_message._M_dataplus._M_p,
                    local_230.m_message.field_2._M_allocated_capacity + 1);
  }
  iutest::detail::iuFilePath::RemoveExtension((iuFilePath *)local_1b8,&local_1d8,"exe");
  iutest::internal::CmpHelperEQ<char[13],iutest::detail::iuFilePath>
            (&local_230,(internal *)"\"test.exe.bin\"","path.RemoveExtension(\"exe\")",
             "test.exe.bin",(char (*) [13])local_1b8,in_R9);
  if ((pointer)local_1b8._0_8_ != pcVar4) {
    operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
  }
  if (local_230.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,local_230.m_message._M_dataplus._M_p,&local_231);
    local_208.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filepath_tests.cpp"
    ;
    local_208.m_part_result.super_iuCodeMessage.m_line = 0xb1;
    local_208.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_208,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar2) {
      operator_delete(local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_208.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_230.m_message._M_dataplus._M_p,
                    local_230.m_message.field_2._M_allocated_capacity + 1);
  }
  _Var5._M_p = local_1d8.m_path._M_dataplus._M_p;
  pcVar6 = strrchr(local_1d8.m_path._M_dataplus._M_p,0x2e);
  if (pcVar6 == (char *)0x0) {
    local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_208,_Var5._M_p,_Var5._M_p + local_1d8.m_path._M_string_length);
  }
  else {
    local_1b8._0_8_ = pcVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,_Var5._M_p,pcVar6);
    iutest::detail::iuFilePath::iuFilePath((iuFilePath *)&local_208,(string *)local_1b8);
    if ((pointer)local_1b8._0_8_ != pcVar4) {
      operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
    }
  }
  iutest::internal::CmpHelperEQ<char[9],iutest::detail::iuFilePath>
            (&local_230,(internal *)"\"test.exe\"","path.RemoveExtension()","test.exe",
             (char (*) [9])&local_208,in_R9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar2) {
    operator_delete(local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    local_208.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity + 1);
  }
  if (local_230.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,local_230.m_message._M_dataplus._M_p,&local_231);
    local_208.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filepath_tests.cpp"
    ;
    local_208.m_part_result.super_iuCodeMessage.m_line = 0xb3;
    local_208.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_208,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar2) {
      operator_delete(local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_208.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_230.m_message._M_dataplus._M_p,
                    local_230.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8.m_path._M_dataplus._M_p != paVar3) {
    operator_delete(local_1d8.m_path._M_dataplus._M_p,
                    local_1d8.m_path.field_2._M_allocated_capacity + 1);
  }
  iutest::detail::iuFilePath::iuFilePath(&local_1d8,"test");
  iutest::detail::iuFilePath::RemoveExtension((iuFilePath *)local_1b8,&local_1d8,"test");
  iutest::internal::CmpHelperEQ<char[5],iutest::detail::iuFilePath>
            (&local_230,(internal *)0x327bbe,"path.RemoveExtension(\"test\")","test",
             (char (*) [5])local_1b8,in_R9);
  if ((pointer)local_1b8._0_8_ != pcVar4) {
    operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
  }
  if (local_230.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,local_230.m_message._M_dataplus._M_p,&local_231);
    local_208.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filepath_tests.cpp"
    ;
    local_208.m_part_result.super_iuCodeMessage.m_line = 0xb8;
    local_208.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_208,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar2) {
      operator_delete(local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_208.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_230.m_message._M_dataplus._M_p,
                    local_230.m_message.field_2._M_allocated_capacity + 1);
  }
  iutest::detail::iuFilePath::RemoveExtension((iuFilePath *)local_1b8,&local_1d8,"exe");
  iutest::internal::CmpHelperEQ<char[5],iutest::detail::iuFilePath>
            (&local_230,(internal *)0x327bbe,"path.RemoveExtension(\"exe\")","test",
             (char (*) [5])local_1b8,in_R9);
  if ((pointer)local_1b8._0_8_ != pcVar4) {
    operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
  }
  if (local_230.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,local_230.m_message._M_dataplus._M_p,&local_231);
    local_208.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filepath_tests.cpp"
    ;
    local_208.m_part_result.super_iuCodeMessage.m_line = 0xb9;
    local_208.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_208,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar2) {
      operator_delete(local_208.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_208.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_230.m_message._M_dataplus._M_p,
                    local_230.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8.m_path._M_dataplus._M_p != paVar3) {
    operator_delete(local_1d8.m_path._M_dataplus._M_p,
                    local_1d8.m_path.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST(FilePath, RemoveExtension)
{
    {
        ::iutest::internal::FilePath path("test.exe");
        IUTEST_EXPECT_EQ("test.exe", path.RemoveExtension("bin"));
        IUTEST_EXPECT_EQ("test", path.RemoveExtension("exe"));
#if !defined(IUTEST_USE_GTEST)
        IUTEST_EXPECT_EQ("test", path.RemoveExtension());
#endif
    }
    {
        ::iutest::internal::FilePath path("test.exe.bin");
        IUTEST_EXPECT_EQ("test.exe", path.RemoveExtension("bin"));
        IUTEST_EXPECT_EQ("test.exe.bin", path.RemoveExtension("exe"));
#if !defined(IUTEST_USE_GTEST)
        IUTEST_EXPECT_EQ("test.exe", path.RemoveExtension());
#endif
    }
    {
        ::iutest::internal::FilePath path("test");
        IUTEST_EXPECT_EQ("test", path.RemoveExtension("test"));
        IUTEST_EXPECT_EQ("test", path.RemoveExtension("exe"));
    }
}